

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManAreDeriveCexSat(Gia_ManAre_t *p,Gia_StaAre_t *pCur,Gia_StaAre_t *pNext,int iOutFailed)

{
  Vec_Int_t *pVVar1;
  lit *begin;
  sat_solver *psVar2;
  int iVar3;
  int iVar4;
  sbyte sVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  int iVar8;
  
  p->vAssumps->nSize = 0;
  uVar7 = 0;
  iVar8 = 0;
  while( true ) {
    pGVar6 = p->pAig;
    iVar3 = pGVar6->nRegs;
    if (iVar3 <= iVar8) break;
    iVar4 = 1;
    if ((((uint)(&pCur[1].iPrev)[(int)uVar7 >> 5] >> (uVar7 & 0x1e) & 1) != 0) ||
       (iVar4 = 0, ((uint)(&pCur[1].iPrev)[(int)uVar7 >> 5] >> (sbyte)(uVar7 & 0x1e) & 2) != 0)) {
      pVVar1 = p->vAssumps;
      iVar3 = Vec_IntEntry(p->vSatNumCis,(pGVar6->vCis->nSize - iVar3) + iVar8);
      iVar3 = Abc_Var2Lit(iVar3,iVar4);
      Vec_IntPush(pVVar1,iVar3);
    }
    iVar8 = iVar8 + 1;
    uVar7 = uVar7 + 2;
  }
  if (pNext != (Gia_StaAre_t *)0x0) {
    uVar7 = 0;
    for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
      iVar4 = 1;
      if ((((uint)(&pNext[1].iPrev)[(int)uVar7 >> 5] >> (uVar7 & 0x1e) & 1) != 0) ||
         (iVar4 = 0, ((uint)(&pNext[1].iPrev)[(int)uVar7 >> 5] >> (sbyte)(uVar7 & 0x1e) & 2) != 0))
      {
        pVVar1 = p->vAssumps;
        iVar3 = Vec_IntEntry(p->vSatNumCos,(pGVar6->vCos->nSize - iVar3) + iVar8);
        iVar3 = Abc_Var2Lit(iVar3,iVar4);
        Vec_IntPush(pVVar1,iVar3);
      }
      pGVar6 = p->pAig;
      iVar3 = pGVar6->nRegs;
      uVar7 = uVar7 + 2;
    }
  }
  if (-1 < iOutFailed) {
    if (pGVar6->vCos->nSize - iVar3 <= iOutFailed) {
      __assert_fail("iOutFailed < Gia_ManPoNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                    ,0x752,
                    "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                   );
    }
    pVVar1 = p->vAssumps;
    iVar8 = Vec_IntEntry(p->vSatNumCos,iOutFailed);
    iVar8 = Abc_Var2Lit(iVar8,0);
    Vec_IntPush(pVVar1,iVar8);
  }
  begin = p->vAssumps->pArray;
  iVar3 = 0;
  iVar8 = sat_solver_solve((sat_solver *)p->pSat,begin,begin + p->vAssumps->nSize,1000000,0,0,0);
  if (iVar8 == 1) {
    p->vCofVars->nSize = 0;
    while( true ) {
      pGVar6 = p->pAig;
      iVar8 = pGVar6->nRegs;
      if (pGVar6->vCis->nSize - iVar8 <= iVar3) break;
      psVar2 = (sat_solver *)p->pSat;
      iVar8 = Vec_IntEntry(p->vSatNumCis,iVar3);
      iVar8 = sat_solver_var_value(psVar2,iVar8);
      if (iVar8 != 0) {
        Vec_IntPush(p->vCofVars,iVar3);
      }
      iVar3 = iVar3 + 1;
    }
    uVar7 = 0;
    iVar3 = 0;
    do {
      if (iVar8 <= iVar3) {
        return;
      }
      sVar5 = (sbyte)(uVar7 & 0x1e);
      if (((uint)(&pCur[1].iPrev)[(int)uVar7 >> 5] >> (uVar7 & 0x1e) & 1) == 0) {
        if (((uint)(&pCur[1].iPrev)[(int)uVar7 >> 5] >> sVar5 & 2) != 0) {
          psVar2 = (sat_solver *)p->pSat;
          iVar8 = Vec_IntEntry(p->vSatNumCis,(pGVar6->vCis->nSize - iVar8) + iVar3);
          iVar8 = sat_solver_var_value(psVar2,iVar8);
          if (iVar8 == 0) {
            __assert_fail("sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                          ,0x76b,
                          "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                         );
          }
        }
      }
      else {
        psVar2 = (sat_solver *)p->pSat;
        iVar8 = Vec_IntEntry(p->vSatNumCis,(pGVar6->vCis->nSize - iVar8) + iVar3);
        iVar8 = sat_solver_var_value(psVar2,iVar8);
        if (iVar8 != 0) {
          __assert_fail("sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                        ,0x769,
                        "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                       );
        }
      }
      psVar2 = (sat_solver *)p->pSat;
      iVar8 = Vec_IntEntry(p->vSatNumCis,(p->pAig->vCis->nSize - p->pAig->nRegs) + iVar3);
      iVar4 = sat_solver_var_value(psVar2,iVar8);
      iVar8 = 1;
      if (iVar4 != 0) {
        iVar8 = 2;
      }
      (&pCur[1].iPrev)[(int)uVar7 >> 5] =
           (Gia_PtrAre_t)((uint)(&pCur[1].iPrev)[(int)uVar7 >> 5] | iVar8 << sVar5);
      iVar3 = iVar3 + 1;
      pGVar6 = p->pAig;
      iVar8 = pGVar6->nRegs;
      uVar7 = uVar7 + 2;
    } while( true );
  }
  puts("SAT problem is not satisfiable. Failure...");
  return;
}

Assistant:

void Gia_ManAreDeriveCexSat( Gia_ManAre_t * p, Gia_StaAre_t * pCur, Gia_StaAre_t * pNext, int iOutFailed )
{
    int i, status;
    // make assuptions
    Vec_IntClear( p->vAssumps );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pCur, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i), 1 ) );
        else if ( Gia_StaHasValue1(pCur, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i), 0 ) );
    }
    if ( pNext )
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pNext, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, Gia_ManPoNum(p->pAig)+i), 1 ) );
        else if ( Gia_StaHasValue1(pNext, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, Gia_ManPoNum(p->pAig)+i), 0 ) );
    }
    if ( iOutFailed >= 0 )
    {
        assert( iOutFailed < Gia_ManPoNum(p->pAig) );
        Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, iOutFailed), 0 ) );
    }
    // solve SAT
    status = sat_solver_solve( (sat_solver *)p->pSat, (int *)Vec_IntArray(p->vAssumps), (int *)Vec_IntArray(p->vAssumps) + Vec_IntSize(p->vAssumps), 
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_True )
    {
        printf( "SAT problem is not satisfiable. Failure...\n" );
        return;
    }
    assert( status == l_True );
    // check the model
    Vec_IntClear( p->vCofVars );
    for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
    {
        if ( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, i) ) )
            Vec_IntPush( p->vCofVars, i );
    }
    // write the current state
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pCur, i) )
            assert( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0 );
        else if ( Gia_StaHasValue1(pCur, i) )
            assert( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 1 );
        // set don't-care value
        if ( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0 )
            Gia_StaSetValue0( pCur, i );
        else
            Gia_StaSetValue1( pCur, i );
    }
}